

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzerSettings.cpp
# Opt level: O0

void __thiscall JtagAnalyzerSettings::JtagAnalyzerSettings(JtagAnalyzerSettings *this)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  JtagTAPState local_20;
  int state_cnt;
  JtagAnalyzerSettings *this_local;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__JtagAnalyzerSettings_00121d58;
  Channel::Channel(&this->mTmsChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::Channel(&this->mTckChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::Channel(&this->mTdiChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::Channel(&this->mTdoChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::Channel(&this->mTrstChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mTAPInitialState = RunTestIdle;
  this->mInstructRegBitOrder = LSB_First;
  this->mDataRegBitOrder = LSB_First;
  this->mShowBitCount = false;
  this->mShiftDRBitsPerDataUnit = 0;
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(&this->mTmsChannelInterface);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(&this->mTckChannelInterface);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(&this->mTdiChannelInterface);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(&this->mTdoChannelInterface);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(&this->mTrstChannelInterface);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList
            (&this->mTAPInitialStateInterface);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList
            (&this->mInstructRegBitOrderInterface);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList
            (&this->mDataRegBitOrderInterface);
  AnalyzerSettingInterfaceInteger::AnalyzerSettingInterfaceInteger(&this->mShiftDRDataUnitInterface)
  ;
  AnalyzerSettingInterfaceBool::AnalyzerSettingInterfaceBool(&this->mShowBitCountInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)&this->mTmsChannelInterface,"TMS");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)&this->mTmsChannelInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)&this->mTckChannelInterface,"TCK");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)&this->mTckChannelInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)&this->mTdiChannelInterface,"TDI");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)&this->mTdiChannelInterface);
  cVar1 = (char)this;
  AnalyzerSettingInterfaceChannel::SetSelectionOfNoneIsAllowed((bool)(cVar1 + -0x58));
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)&this->mTdoChannelInterface,"TDO");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)&this->mTdoChannelInterface);
  AnalyzerSettingInterfaceChannel::SetSelectionOfNoneIsAllowed((bool)(cVar1 + -0x40));
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)&this->mTrstChannelInterface,"TRST");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)&this->mTrstChannelInterface);
  AnalyzerSettingInterfaceChannel::SetSelectionOfNoneIsAllowed((bool)(cVar1 + -0x28));
  AnalyzerSettingInterface::SetTitleAndTooltip
            ((char *)&this->mTAPInitialStateInterface,"TAP initial state");
  for (local_20 = TestLogicReset; (int)local_20 < 0x10; local_20 = local_20 + RunTestIdle) {
    pcVar3 = JtagAnalyzerResults::GetStateDescLong(local_20);
    JtagAnalyzerResults::GetStateDescLong(local_20);
    AnalyzerSettingInterfaceNumberList::AddNumber
              ((double)(int)local_20,(char *)&this->mTAPInitialStateInterface,pcVar3);
  }
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mTAPInitialState);
  AnalyzerSettingInterface::SetTitleAndTooltip
            ((char *)&this->mInstructRegBitOrderInterface,"Shift-IR bit order");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)&this->mInstructRegBitOrderInterface,"Most significant bit first");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)&this->mInstructRegBitOrderInterface,"Least significant bit first");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mInstructRegBitOrder);
  AnalyzerSettingInterface::SetTitleAndTooltip
            ((char *)&this->mDataRegBitOrderInterface,"Shift-DR bit order");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)&this->mDataRegBitOrderInterface,"Most significant bit first");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)&this->mDataRegBitOrderInterface,"Least significant bit first");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mDataRegBitOrder);
  AnalyzerSettingInterface::SetTitleAndTooltip
            ((char *)&this->mShiftDRDataUnitInterface,"Shift-DR data unit");
  uVar2 = (uint)this;
  AnalyzerSettingInterfaceInteger::SetInteger(uVar2 + 0x138);
  AnalyzerSettingInterfaceInteger::SetMin(uVar2 + 0x138);
  AnalyzerSettingInterfaceInteger::SetMax(uVar2 + 0x138);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)&this->mShowBitCountInterface,"");
  AnalyzerSettingInterfaceBool::SetCheckBoxText((char *)&this->mShowBitCountInterface);
  AnalyzerSettingInterfaceBool::SetValue((bool)(cVar1 + 'P'));
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddExportOption(uVar2,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar2,(char *)0x0,"csv");
  AnalyzerSettings::AddExportExtension(uVar2,(char *)0x0,"text");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mTmsChannel,false);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mTckChannel,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mTdiChannel,false);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mTdoChannel,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mTrstChannel,true);
  return;
}

Assistant:

JtagAnalyzerSettings::JtagAnalyzerSettings()
    : mTmsChannel( UNDEFINED_CHANNEL ),
      mTckChannel( UNDEFINED_CHANNEL ),
      mTdiChannel( UNDEFINED_CHANNEL ),
      mTdoChannel( UNDEFINED_CHANNEL ),
      mTrstChannel( UNDEFINED_CHANNEL ),
      mTAPInitialState( RunTestIdle ),
      mInstructRegBitOrder( LSB_First ),
      mDataRegBitOrder( LSB_First ),
      mShowBitCount( false ),
      mShiftDRBitsPerDataUnit( 0 )
{
    // init the interfaces
    mTmsChannelInterface.SetTitleAndTooltip( "TMS", "JTAG Test mode select" );
    mTmsChannelInterface.SetChannel( mTmsChannel );

    mTckChannelInterface.SetTitleAndTooltip( "TCK", "JTAG Test clock" );
    mTckChannelInterface.SetChannel( mTckChannel );

    mTdiChannelInterface.SetTitleAndTooltip( "TDI", "JTAG Test data input" );
    mTdiChannelInterface.SetChannel( mTdiChannel );
    mTdiChannelInterface.SetSelectionOfNoneIsAllowed( true );

    mTdoChannelInterface.SetTitleAndTooltip( "TDO", "JTAG Test data output" );
    mTdoChannelInterface.SetChannel( mTdoChannel );
    mTdoChannelInterface.SetSelectionOfNoneIsAllowed( true );

    mTrstChannelInterface.SetTitleAndTooltip( "TRST", "JTAG Test reset" );
    mTrstChannelInterface.SetChannel( mTrstChannel );
    mTrstChannelInterface.SetSelectionOfNoneIsAllowed( true );

    mTAPInitialStateInterface.SetTitleAndTooltip( "TAP initial state", "JTAG TAP controller initial state" );
    int state_cnt;
    for( state_cnt = 0; state_cnt < NUM_TAP_STATES; ++state_cnt )
        mTAPInitialStateInterface.AddNumber( state_cnt, JtagAnalyzerResults::GetStateDescLong( JtagTAPState( state_cnt ) ),
                                             JtagAnalyzerResults::GetStateDescLong( JtagTAPState( state_cnt ) ) );

    mTAPInitialStateInterface.SetNumber( mTAPInitialState );

    mInstructRegBitOrderInterface.SetTitleAndTooltip( "Shift-IR bit order", "Instruction register shift bit order" );
    mInstructRegBitOrderInterface.AddNumber( MSB_First, "Most significant bit first",
                                             "Instruction register shift MOST significant bit first" );
    mInstructRegBitOrderInterface.AddNumber( LSB_First, "Least significant bit first",
                                             "Instruction register shift LEAST significant bit first" );
    mInstructRegBitOrderInterface.SetNumber( mInstructRegBitOrder );

    mDataRegBitOrderInterface.SetTitleAndTooltip( "Shift-DR bit order", "Data register shift bit order" );
    mDataRegBitOrderInterface.AddNumber( MSB_First, "Most significant bit first", "Data register shift MOST significant bit first" );
    mDataRegBitOrderInterface.AddNumber( LSB_First, "Least significant bit first", "Data register shift LEAST significant bit first" );
    mDataRegBitOrderInterface.SetNumber( mDataRegBitOrder );

    mShiftDRDataUnitInterface.SetTitleAndTooltip( "Shift-DR data unit", "Number of bits to report as a single data unit. 0 to only report when TAP state changes." );
    mShiftDRDataUnitInterface.SetInteger( mShiftDRBitsPerDataUnit );
    mShiftDRDataUnitInterface.SetMin( 0 );
    mShiftDRDataUnitInterface.SetMax( 65536 );

    mShowBitCountInterface.SetTitleAndTooltip( "", "Used to count bits sent during Shift state" );
    mShowBitCountInterface.SetCheckBoxText( "Show TDI/TDO bit counts" );
    mShowBitCountInterface.SetValue( mShowBitCount );

    // add the interfaces
    AddInterface( &mTmsChannelInterface );
    AddInterface( &mTckChannelInterface );
    AddInterface( &mTdiChannelInterface );
    AddInterface( &mTdoChannelInterface );
    AddInterface( &mTrstChannelInterface );

    AddInterface( &mTAPInitialStateInterface );
    AddInterface( &mInstructRegBitOrderInterface );
    AddInterface( &mDataRegBitOrderInterface );
    AddInterface( &mShiftDRDataUnitInterface );

    AddInterface( &mShowBitCountInterface );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "csv", "csv" );
    AddExportExtension( 0, "text", "txt" );

    ClearChannels();

    AddChannel( mTmsChannel, "TMS", false );
    AddChannel( mTckChannel, "TCK", false );
    AddChannel( mTdiChannel, "TDI", false );
    AddChannel( mTdoChannel, "TDO", false );
    AddChannel( mTrstChannel, "TRST", false );
}